

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

char * fmt::v8::detail::
       parse_align<char,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v8::detail::specs_handler<char>_> *handler)

{
  char cVar1;
  align_t align;
  char *pcVar2;
  bool bVar3;
  basic_string_view<char> fill;
  
  pcVar2 = begin + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                 [(byte)*begin >> 3] == 0) +
                   (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                         [(byte)*begin >> 3];
  if (end <= begin + (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                                   [(byte)*begin >> 3] == 0) +
                     (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                           [(byte)*begin >> 3]) {
    pcVar2 = begin;
  }
  do {
    cVar1 = *pcVar2;
    if (cVar1 == '^') {
      align = center;
LAB_0011d8a5:
      fill.size_ = (long)pcVar2 - (long)begin;
      if (fill.size_ != 0) {
        if (*begin == 0x7b) {
          specs_handler<char>::on_error
                    (&handler->super_specs_handler<char>,"invalid fill character \'{\'");
          return begin;
        }
        fill.data_ = begin;
        specs_setter<char>::on_fill((specs_setter<char> *)handler,fill);
        begin = pcVar2;
      }
      specs_checker<fmt::v8::detail::specs_handler<char>_>::on_align(handler,align);
      return begin + 1;
    }
    if (cVar1 == '>') {
      align = right;
      goto LAB_0011d8a5;
    }
    if (cVar1 == '<') {
      align = left;
      goto LAB_0011d8a5;
    }
    bVar3 = pcVar2 == begin;
    pcVar2 = begin;
    if (bVar3) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}